

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkExprNN(Walker *pWalker,Expr *pExpr)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Walker *in_RSI;
  Window *in_RDI;
  int rc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  while( true ) {
    uVar2 = (*(code *)in_RDI->zBase)(in_RDI,in_RSI);
    if (uVar2 != 0) {
      return uVar2 & 2;
    }
    if (((ulong)in_RSI->pParse & 0x81000000000000) != 0) {
      return 0;
    }
    if ((in_RSI->xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) &&
       (iVar3 = sqlite3WalkExprNN(in_RSI,(Expr *)(ulong)in_stack_ffffffffffffffe0), iVar3 != 0)) {
      return 2;
    }
    if (in_RSI->xSelectCallback2 == (_func_void_Walker_ptr_Select_ptr *)0x0) break;
    in_RSI = (Walker *)in_RSI->xSelectCallback2;
  }
  if (((ulong)in_RSI->pParse & 0x100000000000) != 0) {
    iVar3 = sqlite3WalkSelect(in_RSI,(Select *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    if (iVar3 == 0) {
      return 0;
    }
    return 2;
  }
  lVar1._0_4_ = in_RSI->walkerDepth;
  lVar1._4_2_ = in_RSI->eCode;
  lVar1._6_2_ = in_RSI->mWFlags;
  if ((lVar1 != 0) &&
     (iVar3 = sqlite3WalkExprList(in_RSI,(ExprList *)CONCAT44(uVar2,in_stack_ffffffffffffffe0)),
     iVar3 != 0)) {
    return 2;
  }
  if (((ulong)in_RSI->pParse & 0x100000000000000) == 0) {
    return 0;
  }
  iVar3 = walkWindowList((Walker *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (iVar3 == 0) {
    return 0;
  }
  return 2;
}

Assistant:

int sqlite3WalkExprNN(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pLeft && sqlite3WalkExprNN(pWalker, pExpr->pLeft) ){
        return WRC_Abort;
      }
      if( pExpr->pRight ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprUseXSelect(pExpr) ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else{
        if( pExpr->x.pList ){
          if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
        }
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pExpr, EP_WinFunc) ){
          if( walkWindowList(pWalker, pExpr->y.pWin, 1) ) return WRC_Abort;
        }
#endif
      }
    }
    break;
  }
  return WRC_Continue;
}